

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

MemberSyntax * __thiscall slang::parsing::Parser::parseClockingItem(Parser *this)

{
  Token output_00;
  Token keyword;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements;
  Token input_00;
  Token semi_00;
  Token semi_01;
  bool bVar1;
  MemberSyntax *pMVar2;
  ClockingDirectionSyntax *pCVar3;
  EVP_PKEY_CTX *src;
  Info *extraout_RDX;
  undefined8 *in_RDI;
  Token TVar4;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> decls;
  Token semi;
  ClockingDirectionSyntax *direction;
  ClockingSkewSyntax *outputSkew;
  ClockingSkewSyntax *inputSkew;
  Token output;
  Token input;
  Token def;
  ParserBase *in_stack_fffffffffffffca8;
  ClockingSkewSyntax *pCVar5;
  SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *decls_00;
  Token *in_stack_fffffffffffffcb0;
  ClockingDirectionSyntax *direction_00;
  undefined4 in_stack_fffffffffffffcb8;
  undefined4 uVar6;
  undefined2 in_stack_fffffffffffffcbc;
  TokenKind in_stack_fffffffffffffcbe;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffcc0;
  undefined8 in_stack_fffffffffffffcc8;
  ParserBase *in_stack_fffffffffffffcd0;
  Info *pIVar7;
  Parser *in_stack_fffffffffffffcd8;
  ClockingSkewSyntax *in_stack_fffffffffffffce0;
  undefined6 in_stack_fffffffffffffd10;
  TokenKind TVar8;
  SourceLocation in_stack_fffffffffffffd18;
  undefined8 in_stack_fffffffffffffd20;
  DiagCode code;
  undefined8 in_stack_fffffffffffffd38;
  TokenKind kind;
  ParserBase *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffdc8;
  TokenKind in_stack_fffffffffffffdd4;
  TokenKind in_stack_fffffffffffffdd6;
  SmallVectorBase<slang::syntax::TokenOrSyntax> *in_stack_fffffffffffffdd8;
  ParserBase *in_stack_fffffffffffffde0;
  DiagCode in_stack_fffffffffffffdf0;
  Info *in_stack_fffffffffffffdf8;
  AllowEmpty in_stack_fffffffffffffe00;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *local_1a8;
  Info *local_1a0;
  string_view local_128;
  SourceLocation local_118;
  SourceLocation local_110;
  undefined4 local_104;
  string_view local_100;
  SourceLocation local_f0;
  SourceLocation local_e8;
  undefined4 local_dc;
  Token local_d8;
  string_view local_c8;
  SourceLocation local_b8;
  SourceLocation local_b0;
  undefined4 local_a4;
  Token local_a0;
  SourceLocation local_90;
  undefined4 local_84;
  Token local_80;
  ClockingSkewSyntax *local_70;
  ClockingSkewSyntax *local_68;
  Token local_60;
  Token local_50;
  Token local_40;
  Token local_30;
  Token local_20;
  ClockingItemSyntax *local_8;
  
  kind = (TokenKind)((ulong)in_stack_fffffffffffffd38 >> 0x30);
  code = SUB84((ulong)in_stack_fffffffffffffd20 >> 0x20,0);
  Token::Token(in_stack_fffffffffffffcb0);
  local_30 = ParserBase::peek(in_stack_fffffffffffffca8);
  TVar8 = local_30.kind;
  if (local_30.kind == DefaultKeyword) {
    TVar4 = ParserBase::consume(in_stack_fffffffffffffcd0);
    local_40._0_8_ = TVar4._0_8_;
    local_20.kind = local_40.kind;
    local_20._2_1_ = local_40._2_1_;
    local_20.numFlags.raw = local_40.numFlags.raw;
    local_20.rawLen = local_40.rawLen;
    local_40.info = TVar4.info;
    local_20.info = local_40.info;
    local_40 = TVar4;
  }
  else if ((1 < (ushort)(local_30.kind - InOutKeyword)) && (local_30.kind != OutputKeyword)) {
    pMVar2 = parseSingleMember((Parser *)in_stack_fffffffffffffcc0._M_extent_value,
                               CONCAT22(in_stack_fffffffffffffcbe,in_stack_fffffffffffffcbc));
    return pMVar2;
  }
  Token::Token(in_stack_fffffffffffffcb0);
  Token::Token(in_stack_fffffffffffffcb0);
  local_68 = (ClockingSkewSyntax *)0x0;
  local_70 = (ClockingSkewSyntax *)0x0;
  bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffcc0._M_extent_value,
                           in_stack_fffffffffffffcbe);
  if (bVar1) {
    TVar4 = ParserBase::consume(in_stack_fffffffffffffcd0);
    local_80._0_8_ = TVar4._0_8_;
    local_50.kind = local_80.kind;
    local_50._2_1_ = local_80._2_1_;
    local_50.numFlags.raw = local_80.numFlags.raw;
    local_50.rawLen = local_80.rawLen;
    local_80.info = TVar4.info;
    local_50.info = local_80.info;
    local_80 = TVar4;
    bVar1 = Token::operator_cast_to_bool((Token *)0x8ddd1d);
    if (bVar1) {
      local_84 = 0x620005;
      local_90 = Token::location(&local_50);
      ParserBase::addDiag((ParserBase *)CONCAT26(TVar8,in_stack_fffffffffffffd10),code,
                          in_stack_fffffffffffffd18);
    }
  }
  else {
    bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffcc0._M_extent_value,
                             in_stack_fffffffffffffcbe);
    if (bVar1) {
      TVar4 = ParserBase::consume(in_stack_fffffffffffffcd0);
      local_a0._0_8_ = TVar4._0_8_;
      local_50.kind = local_a0.kind;
      local_50._2_1_ = local_a0._2_1_;
      local_50.numFlags.raw = local_a0.numFlags.raw;
      local_50.rawLen = local_a0.rawLen;
      local_a0.info = TVar4.info;
      local_50.info = local_a0.info;
      local_a0 = TVar4;
      local_68 = parseClockingSkew(in_stack_fffffffffffffcd8);
      bVar1 = Token::operator_cast_to_bool((Token *)0x8dddd4);
      if ((bVar1) && (local_68 == (ClockingSkewSyntax *)0x0)) {
        local_a4 = 0x330005;
        local_b8 = Token::location(&local_50);
        local_c8 = Token::rawText((Token *)in_stack_fffffffffffffcc0._M_extent_value);
        std::basic_string_view<char,_std::char_traits<char>_>::length(&local_c8);
        local_b0 = SourceLocation::operator+<unsigned_long>
                             ((SourceLocation *)
                              CONCAT26(in_stack_fffffffffffffcbe,
                                       CONCAT24(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8)
                                      ),(unsigned_long)in_stack_fffffffffffffcb0);
        ParserBase::addDiag((ParserBase *)CONCAT26(TVar8,in_stack_fffffffffffffd10),code,
                            in_stack_fffffffffffffd18);
      }
    }
    bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffcc0._M_extent_value,
                             in_stack_fffffffffffffcbe);
    if (bVar1) {
      TVar4 = ParserBase::consume(in_stack_fffffffffffffcd0);
      local_d8._0_8_ = TVar4._0_8_;
      local_60.kind = local_d8.kind;
      local_60._2_1_ = local_d8._2_1_;
      local_60.numFlags.raw = local_d8.numFlags.raw;
      local_60.rawLen = local_d8.rawLen;
      local_d8.info = TVar4.info;
      local_60.info = local_d8.info;
      local_d8 = TVar4;
      local_70 = parseClockingSkew(in_stack_fffffffffffffcd8);
      bVar1 = Token::operator_cast_to_bool((Token *)0x8dded8);
      if ((bVar1) && (local_70 == (ClockingSkewSyntax *)0x0)) {
        local_dc = 0x330005;
        local_f0 = Token::location(&local_60);
        local_100 = Token::rawText((Token *)in_stack_fffffffffffffcc0._M_extent_value);
        std::basic_string_view<char,_std::char_traits<char>_>::length(&local_100);
        local_e8 = SourceLocation::operator+<unsigned_long>
                             ((SourceLocation *)
                              CONCAT26(in_stack_fffffffffffffcbe,
                                       CONCAT24(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8)
                                      ),(unsigned_long)in_stack_fffffffffffffcb0);
        ParserBase::addDiag((ParserBase *)CONCAT26(TVar8,in_stack_fffffffffffffd10),code,
                            in_stack_fffffffffffffd18);
      }
    }
    bVar1 = Token::operator_cast_to_bool((Token *)0x8ddf78);
    if (((bVar1) && (bVar1 = Token::operator_cast_to_bool((Token *)0x8ddf8e), !bVar1)) &&
       (bVar1 = Token::operator_cast_to_bool((Token *)0x8ddfa3), !bVar1)) {
      local_104 = 0x330005;
      local_118 = Token::location(&local_20);
      local_128 = Token::valueText((Token *)in_stack_fffffffffffffcc0._M_extent_value);
      std::basic_string_view<char,_std::char_traits<char>_>::length(&local_128);
      local_110 = SourceLocation::operator+<unsigned_long>
                            ((SourceLocation *)
                             CONCAT26(in_stack_fffffffffffffcbe,
                                      CONCAT24(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8))
                             ,(unsigned_long)in_stack_fffffffffffffcb0);
      ParserBase::addDiag((ParserBase *)CONCAT26(TVar8,in_stack_fffffffffffffd10),code,
                          in_stack_fffffffffffffd18);
    }
  }
  input_00.info = (Info *)in_stack_fffffffffffffcd0;
  input_00.kind = (short)in_stack_fffffffffffffcc8;
  input_00._2_1_ = (char)((ulong)in_stack_fffffffffffffcc8 >> 0x10);
  input_00.numFlags.raw = (char)((ulong)in_stack_fffffffffffffcc8 >> 0x18);
  input_00.rawLen = (int)((ulong)in_stack_fffffffffffffcc8 >> 0x20);
  output_00.rawLen._0_2_ = in_stack_fffffffffffffcbc;
  output_00.kind = (short)in_stack_fffffffffffffcb8;
  output_00._2_1_ = (char)((uint)in_stack_fffffffffffffcb8 >> 0x10);
  output_00.numFlags.raw = (char)((uint)in_stack_fffffffffffffcb8 >> 0x18);
  output_00.rawLen._2_2_ = in_stack_fffffffffffffcbe;
  output_00.info = (Info *)in_stack_fffffffffffffcc0._M_extent_value;
  pCVar5 = local_70;
  pCVar3 = slang::syntax::SyntaxFactory::clockingDirection
                     ((SyntaxFactory *)in_stack_fffffffffffffcb0,input_00,local_70,output_00,
                      in_stack_fffffffffffffce0);
  uVar6 = (undefined4)((ulong)pCVar5 >> 0x20);
  bVar1 = Token::operator_cast_to_bool((Token *)0x8de0c0);
  if (bVar1) {
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
               in_stack_fffffffffffffcc0._M_extent_value,
               (nullptr_t)
               CONCAT26(in_stack_fffffffffffffcbe,
                        CONCAT24(in_stack_fffffffffffffcbc,in_stack_fffffffffffffcb8)));
    TVar4 = ParserBase::expect(in_stack_fffffffffffffd40,kind);
    local_1a8 = TVar4._0_8_;
    local_1a0 = TVar4.info;
    keyword.rawLen._0_2_ = in_stack_fffffffffffffcbc;
    keyword.kind = (short)in_stack_fffffffffffffcb8;
    keyword._2_1_ = (char)((uint)in_stack_fffffffffffffcb8 >> 0x10);
    keyword.numFlags.raw = (char)((uint)in_stack_fffffffffffffcb8 >> 0x18);
    keyword.rawLen._2_2_ = in_stack_fffffffffffffcbe;
    keyword.info = (Info *)in_stack_fffffffffffffcc0._M_extent_value;
    semi_01.info = (Info *)in_stack_fffffffffffffcd8;
    semi_01._0_8_ = in_stack_fffffffffffffcd0;
    local_8 = (ClockingItemSyntax *)
              slang::syntax::SyntaxFactory::defaultSkewItem
                        ((SyntaxFactory *)local_1a0,local_1a8,keyword,
                         (ClockingDirectionSyntax *)0x8de175,semi_01);
  }
  else {
    Token::Token(in_stack_fffffffffffffcb0);
    SmallVector<slang::syntax::TokenOrSyntax,_4UL>::SmallVector
              ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x8de1a6);
    direction_00 = (ClockingDirectionSyntax *)&stack0xfffffffffffffdc0;
    decls_00 = (SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *)CONCAT44(uVar6,0x410005);
    uVar6 = 0;
    ParserBase::
    parseList<&slang::syntax::SyntaxFacts::isIdentifierOrComma,&slang::syntax::SyntaxFacts::isSemicolon,slang::parsing::Parser::parseClockingItem()::__0>
              (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd6,
               in_stack_fffffffffffffdd4,(Token *)CONCAT44(0x410005,in_stack_fffffffffffffdc8),
               (RequireItems)((ulong)in_RDI >> 0x20),in_stack_fffffffffffffdf0,
               (anon_class_8_1_8991fb9c *)in_stack_fffffffffffffdf8,in_stack_fffffffffffffe00);
    slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
              ((SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
               in_stack_fffffffffffffcc0._M_extent_value,
               (nullptr_t)
               CONCAT26(in_stack_fffffffffffffcbe,CONCAT24(in_stack_fffffffffffffcbc,uVar6)));
    SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
              ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)&stack0xfffffffffffffdd0,
               (EVP_PKEY_CTX *)*in_RDI,src);
    elements._M_ptr._4_2_ = in_stack_fffffffffffffcbc;
    elements._M_ptr._0_4_ = uVar6;
    elements._M_ptr._6_2_ = in_stack_fffffffffffffcbe;
    elements._M_extent._M_extent_value = in_stack_fffffffffffffcc0._M_extent_value;
    pIVar7 = extraout_RDX;
    slang::syntax::SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax>::SeparatedSyntaxList
              ((SeparatedSyntaxList<slang::syntax::AttributeSpecSyntax> *)direction_00,elements);
    semi_00.info = pIVar7;
    semi_00._0_8_ = pCVar3;
    local_8 = slang::syntax::SyntaxFactory::clockingItem
                        ((SyntaxFactory *)in_stack_fffffffffffffcc0._M_extent_value,
                         (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)
                         CONCAT26(in_stack_fffffffffffffcbe,
                                  CONCAT24(in_stack_fffffffffffffcbc,uVar6)),direction_00,decls_00,
                         semi_00);
    SmallVector<slang::syntax::TokenOrSyntax,_4UL>::~SmallVector
              ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x8de2df);
  }
  return &local_8->super_MemberSyntax;
}

Assistant:

MemberSyntax* Parser::parseClockingItem() {
    Token def;
    switch (peek().kind) {
        case TokenKind::DefaultKeyword:
            def = consume();
            break;
        case TokenKind::InputKeyword:
        case TokenKind::OutputKeyword:
        case TokenKind::InOutKeyword:
            break;
        default:
            return parseSingleMember(SyntaxKind::ClockingItem);
    }

    Token input, output;
    ClockingSkewSyntax* inputSkew = nullptr;
    ClockingSkewSyntax* outputSkew = nullptr;
    if (peek(TokenKind::InOutKeyword)) {
        input = consume();
        if (def)
            addDiag(diag::InOutDefaultSkew, input.location());
    }
    else {
        if (peek(TokenKind::InputKeyword)) {
            input = consume();
            inputSkew = parseClockingSkew();
            if (def && !inputSkew)
                addDiag(diag::ExpectedClockingSkew, input.location() + input.rawText().length());
        }

        if (peek(TokenKind::OutputKeyword)) {
            output = consume();
            outputSkew = parseClockingSkew();
            if (def && !outputSkew)
                addDiag(diag::ExpectedClockingSkew, output.location() + output.rawText().length());
        }

        if (def && !input && !output)
            addDiag(diag::ExpectedClockingSkew, def.location() + def.valueText().length());
    }

    auto& direction = factory.clockingDirection(input, inputSkew, output, outputSkew);
    if (def)
        return &factory.defaultSkewItem(nullptr, def, direction, expect(TokenKind::Semicolon));

    Token semi;
    SmallVector<TokenOrSyntax, 4> decls;
    parseList<isIdentifierOrComma, isSemicolon>(decls, TokenKind::Semicolon, TokenKind::Comma, semi,
                                                RequireItems::True, diag::ExpectedIdentifier,
                                                [this] { return &parseAttributeSpec(); });

    return &factory.clockingItem(nullptr, direction, decls.copy(alloc), semi);
}